

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void get_variance_stats(AV1_COMP *cpi,MACROBLOCK *x,int num_planes,int64_t *src_var,int64_t *rec_var
                       )

{
  uint uVar1;
  long *in_RCX;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  long *in_R8;
  int64_t var;
  uint sse;
  BLOCK_SIZE bs;
  macroblockd_plane *pd;
  macroblock_plane *p;
  int plane;
  int dclevel_stride;
  uint8_t dclevel [16384];
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  undefined1 local_4058 [7];
  BLOCK_SIZE local_4051;
  long local_4050;
  long local_4048;
  int local_4040;
  uint local_403c;
  undefined1 local_4038 [16384];
  BLOCK_SIZE *local_38;
  long local_30;
  long *local_28;
  long *local_20;
  int local_14;
  long local_10;
  long *local_8;
  
  local_30 = in_RSI + 0x1a0;
  local_38 = (BLOCK_SIZE *)**(undefined8 **)(in_RSI + 0x2058);
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_4038,0x80,0x4000);
  local_403c = (uint)block_size_wide[*local_38];
  *local_20 = 0;
  *local_28 = 0;
  local_4040 = 0;
  while ((local_4040 < local_14 && ((local_4040 == 0 || ((*(byte *)(local_30 + 0xc) & 1) != 0))))) {
    local_4048 = local_10 + (long)local_4040 * 0x88;
    local_4050 = local_30 + 0x10 + (long)local_4040 * 0xa30;
    local_4051 = get_plane_block_size(*local_38,*(int *)(local_4050 + 4),*(int *)(local_4050 + 8));
    uVar1 = (**(code **)(*local_8 + (ulong)local_4051 * 0x70 + 0xc918))
                      (*(undefined8 *)(local_4048 + 0x30),*(undefined4 *)(local_4048 + 0x48),
                       local_4038,local_403c,local_4058);
    *local_20 = (ulong)uVar1 + *local_20;
    uVar1 = (**(code **)(*local_8 + (ulong)local_4051 * 0x70 + 0xc918))
                      (*(undefined8 *)(local_4050 + 0x10),*(undefined4 *)(local_4050 + 0x28),
                       local_4038,local_403c,local_4058);
    *local_28 = (ulong)uVar1 + *local_28;
    local_4040 = local_4040 + 1;
  }
  *local_20 = *local_20 << 4;
  *local_28 = *local_28 << 4;
  return;
}

Assistant:

static void get_variance_stats(const AV1_COMP *cpi, const MACROBLOCK *x,
                               int num_planes, int64_t *src_var,
                               int64_t *rec_var) {
  const MACROBLOCKD *xd = &x->e_mbd;
  const MB_MODE_INFO *mbmi = xd->mi[0];

  DECLARE_ALIGNED(16, uint8_t, dclevel[MAX_SB_SQUARE]);
  memset(dclevel, 128, sizeof(dclevel));
  int dclevel_stride = block_size_wide[mbmi->bsize];

  *src_var = 0;
  *rec_var = 0;

  for (int plane = 0; plane < num_planes; ++plane) {
    if (plane && !xd->is_chroma_ref) break;

    const struct macroblock_plane *const p = &x->plane[plane];
    const struct macroblockd_plane *const pd = &xd->plane[plane];
    const BLOCK_SIZE bs =
        get_plane_block_size(mbmi->bsize, pd->subsampling_x, pd->subsampling_y);
    unsigned int sse;

    int64_t var = cpi->ppi->fn_ptr[bs].vf(p->src.buf, p->src.stride, dclevel,
                                          dclevel_stride, &sse);

    *src_var += var;

    var = cpi->ppi->fn_ptr[bs].vf(pd->dst.buf, pd->dst.stride, dclevel,
                                  dclevel_stride, &sse);

    *rec_var += var;
  }

  *src_var <<= 4;
  *rec_var <<= 4;
}